

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUnitTest.h
# Opt level: O3

void Microsoft::VisualStudio::CppUnitTestFramework::Assert::AreEqual<void_const*>
               (void **expected,void **actual,wchar_t *message)

{
  wostream *pwVar1;
  size_t sVar2;
  void *ptr;
  void *ptr_00;
  wstring local_60;
  wstring local_40;
  
  if (*expected == *actual) {
    return;
  }
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
            ((wostream *)&std::wcerr,L"Assert failed. Expected:",0x18);
  ToString<void_const>(&local_40,(Assert *)*expected,ptr);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     ((wostream *)&std::wcerr,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar1,L" Actual:",8);
  ToString<void_const>(&local_60,(Assert *)*actual,ptr_00);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (message != (wchar_t *)0x0) {
    sVar2 = wcslen(message);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcerr,message,sVar2);
    std::endl<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcerr);
  }
  exit(1);
}

Assistant:

static bool Equals(const T& a, const T& b)
    {
        return a == b;
    }